

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr.hpp
# Opt level: O0

shared_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_> * __thiscall
boost::shared_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_>::operator=
          (shared_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_> *this,
          shared_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_> *r)

{
  shared_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_> *in_RDI;
  shared_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_> *in_stack_ffffffffffffffe0;
  
  shared_ptr(in_stack_ffffffffffffffe0,in_RDI);
  swap(in_stack_ffffffffffffffe0,in_RDI);
  ~shared_ptr((shared_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_> *)0x25641e);
  return in_RDI;
}

Assistant:

shared_ptr & operator=( shared_ptr && r ) BOOST_SP_NOEXCEPT
    {
        this_type( static_cast< shared_ptr && >( r ) ).swap( *this );
        return *this;
    }